

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::RegisterSharedValidationInterface
          (ValidationSignals *this,shared_ptr<CValidationInterface> callbacks)

{
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> this_00;
  element_type *peVar1;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks_00;
  element_type local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  long local_18;
  
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  peVar1 = callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->m_internals)._M_t.
       super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
       _M_t.
       super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
       super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl;
  local_28._vptr_CValidationInterface = peVar1->_vptr_CValidationInterface;
  _Stack_20._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1[1]._vptr_CValidationInterface;
  peVar1[1]._vptr_CValidationInterface = (_func_int **)0x0;
  peVar1->_vptr_CValidationInterface = (_func_int **)0x0;
  callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28;
  ValidationSignalsImpl::Register(this_00._M_head_impl,callbacks_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::RegisterSharedValidationInterface(std::shared_ptr<CValidationInterface> callbacks)
{
    // Each connection captures the shared_ptr to ensure that each callback is
    // executed before the subscriber is destroyed. For more details see #18338.
    m_internals->Register(std::move(callbacks));
}